

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# power.c
# Opt level: O3

int envy_bios_parse_power_unk50(envy_bios *bios)

{
  uint8_t uVar1;
  byte bVar2;
  envy_bios_power_unk50_entry *peVar3;
  int iVar4;
  uint uVar5;
  uint32_t uVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  int iVar11;
  
  uVar7 = (bios->power).unk50.offset;
  iVar8 = -0x16;
  if ((ulong)uVar7 != 0) {
    if (uVar7 < bios->length) {
      uVar1 = bios->data[uVar7];
      (bios->power).unk50.version = uVar1;
    }
    else {
      (bios->power).unk50.version = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
      uVar1 = (bios->power).unk50.version;
    }
    if (uVar1 == '\x10') {
      uVar6 = (bios->power).unk50.offset;
      uVar7 = uVar6 + 1;
      uVar5 = bios->length;
      if (uVar7 < uVar5) {
        (bios->power).unk50.hlen = bios->data[uVar7];
        iVar8 = 0;
      }
      else {
        (bios->power).unk50.hlen = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n",(ulong)uVar7);
        uVar6 = (bios->power).unk50.offset;
        uVar5 = bios->length;
        iVar8 = -0xe;
      }
      uVar7 = uVar6 + 2;
      if (uVar7 < uVar5) {
        (bios->power).unk50.rlen = bios->data[uVar7];
        iVar11 = 0;
      }
      else {
        (bios->power).unk50.rlen = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n",(ulong)uVar7);
        uVar6 = (bios->power).unk50.offset;
        uVar5 = bios->length;
        iVar11 = -0xe;
      }
      if (uVar6 + 3 < uVar5) {
        bVar2 = bios->data[uVar6 + 3];
        (bios->power).unk50.entriesnum = bVar2;
        iVar4 = 0;
      }
      else {
        (bios->power).unk50.entriesnum = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        bVar2 = (bios->power).unk50.entriesnum;
        iVar4 = -0xe;
      }
      (bios->power).unk50.valid = (iVar11 == 0 && iVar8 == 0) && iVar4 == 0;
      peVar3 = (envy_bios_power_unk50_entry *)malloc((ulong)((uint)bVar2 * 4) * 5);
      (bios->power).unk50.entries = peVar3;
      if (bVar2 != 0) {
        lVar10 = 0;
        uVar9 = 0;
        do {
          peVar3 = (bios->power).unk50.entries;
          uVar7 = (uint)(bios->power).unk50.rlen * (int)uVar9 +
                  (uint)(bios->power).unk50.hlen + (bios->power).unk50.offset;
          *(uint *)((long)&peVar3->offset + lVar10) = uVar7;
          if (uVar7 < bios->length) {
            (&peVar3->mode)[lVar10] = bios->data[uVar7];
          }
          else {
            (&peVar3->mode)[lVar10] = '\0';
            fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
            uVar7 = *(uint *)((long)&peVar3->offset + lVar10);
          }
          uVar5 = bios->length;
          if (uVar7 + 3 < uVar5) {
            *(ushort *)((long)&peVar3->t0 + lVar10) =
                 CONCAT11(bios->data[uVar7 + 3],bios->data[uVar7 + 2]);
          }
          else {
            *(undefined2 *)((long)&peVar3->t0 + lVar10) = 0;
            fprintf(_stderr,"requested OOB u16 at 0x%04x\n",(ulong)(uVar7 + 2));
            uVar7 = *(uint *)((long)&peVar3->offset + lVar10);
            uVar5 = bios->length;
          }
          if (uVar7 + 5 < uVar5) {
            *(ushort *)((long)&peVar3->t1 + lVar10) =
                 CONCAT11(bios->data[uVar7 + 5],bios->data[uVar7 + 4]);
          }
          else {
            *(undefined2 *)((long)&peVar3->t1 + lVar10) = 0;
            fprintf(_stderr,"requested OOB u16 at 0x%04x\n",(ulong)(uVar7 + 4));
            uVar7 = *(uint *)((long)&peVar3->offset + lVar10);
            uVar5 = bios->length;
          }
          if (uVar7 + 7 < uVar5) {
            *(ushort *)((long)&peVar3->t2 + lVar10) =
                 CONCAT11(bios->data[uVar7 + 7],bios->data[uVar7 + 6]);
          }
          else {
            *(undefined2 *)((long)&peVar3->t2 + lVar10) = 0;
            fprintf(_stderr,"requested OOB u16 at 0x%04x\n",(ulong)(uVar7 + 6));
            uVar7 = *(uint *)((long)&peVar3->offset + lVar10);
            uVar5 = bios->length;
          }
          if (uVar7 + 9 < uVar5) {
            *(ushort *)((long)&peVar3->interval_us + lVar10) =
                 CONCAT11(bios->data[uVar7 + 9],bios->data[uVar7 + 8]);
          }
          else {
            *(undefined2 *)((long)&peVar3->interval_us + lVar10) = 0;
            fprintf(_stderr,"requested OOB u16 at 0x%04x\n",(ulong)(uVar7 + 8));
            uVar7 = *(uint *)((long)&peVar3->offset + lVar10);
            uVar5 = bios->length;
          }
          if (uVar7 + 0x13 < uVar5) {
            *(ushort *)((long)&peVar3->down_off + lVar10) =
                 CONCAT11(bios->data[uVar7 + 0x13],bios->data[uVar7 + 0x12]);
          }
          else {
            *(undefined2 *)((long)&peVar3->down_off + lVar10) = 0;
            fprintf(_stderr,"requested OOB u16 at 0x%04x\n",(ulong)(uVar7 + 0x12));
            uVar7 = *(uint *)((long)&peVar3->offset + lVar10);
            uVar5 = bios->length;
          }
          if (uVar7 + 0x15 < uVar5) {
            *(ushort *)((long)&peVar3->up_off + lVar10) =
                 CONCAT11(bios->data[uVar7 + 0x15],bios->data[uVar7 + 0x14]);
          }
          else {
            *(undefined2 *)((long)&peVar3->up_off + lVar10) = 0;
            fprintf(_stderr,"requested OOB u16 at 0x%04x\n",(ulong)(uVar7 + 0x14));
          }
          uVar9 = uVar9 + 1;
          lVar10 = lVar10 + 0x14;
        } while (uVar9 < (bios->power).unk50.entriesnum);
      }
      iVar8 = 0;
    }
    else {
      envy_bios_parse_power_unk50_cold_1();
    }
  }
  return iVar8;
}

Assistant:

int envy_bios_parse_power_unk50(struct envy_bios *bios) {
	struct envy_bios_power_unk50 *unk50 = &bios->power.unk50;
	int i, err = 0;

	if (!unk50->offset)
		return -EINVAL;

	bios_u8(bios, unk50->offset + 0x0, &unk50->version);
	switch(unk50->version) {
	case 0x10:
		err |= bios_u8(bios, unk50->offset + 0x1, &unk50->hlen);
		err |= bios_u8(bios, unk50->offset + 0x2, &unk50->rlen);
		err |= bios_u8(bios, unk50->offset + 0x3, &unk50->entriesnum);
		unk50->valid = !err;
		break;
	default:
		ENVY_BIOS_ERR("Unknown THERMAL POLICY table version 0x%x\n", unk50->version);
		return -EINVAL;
	};

	err = 0;
	unk50->entries = malloc(unk50->entriesnum * sizeof(struct envy_bios_power_unk50_entry));
	for (i = 0; i < unk50->entriesnum; i++) {
		struct envy_bios_power_unk50_entry *e = &unk50->entries[i];

		e->offset = unk50->offset + unk50->hlen + i * unk50->rlen;
		bios_u8 (bios, e->offset + 0x0, &e->mode);
		bios_u16(bios, e->offset + 0x2, &e->t0);
		bios_u16(bios, e->offset + 0x4, &e->t1);
		bios_u16(bios, e->offset + 0x6, &e->t2);
		bios_u16(bios, e->offset + 0x8, &e->interval_us);

		bios_u16(bios, e->offset + 0x12, &e->down_off);
		bios_u16(bios, e->offset + 0x14, &e->up_off);
	}

	return 0;
}